

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O0

int yescrypt_kdf_body(yescrypt_shared_t *shared,yescrypt_local_t *local,uint8_t *passwd,
                     size_t passwdlen,uint8_t *salt,size_t saltlen,uint64_t N,uint32_t r,uint32_t p,
                     uint32_t t,yescrypt_flags_t flags,uint8_t *buf,size_t buflen)

{
  undefined1 auVar1 [16];
  int iVar2;
  int *piVar3;
  ulong size;
  void *pvVar4;
  undefined8 in_RCX;
  undefined1 *in_RDX;
  long *in_RSI;
  long in_RDI;
  ulong in_stack_00000008;
  uint in_stack_00000010;
  uint in_stack_00000018;
  int in_stack_00000020;
  uint in_stack_00000028;
  void *in_stack_00000030;
  SHA256_CTX_Y *in_stack_00000038;
  size_t clen;
  SHA256_CTX_Y ctx_2;
  HMAC_SHA256_CTX_Y ctx_1;
  uint32_t i;
  HMAC_SHA256_CTX_Y ctx;
  size_t S_size;
  uint8_t *dkp;
  uint8_t dk [32];
  uint8_t sha256 [32];
  salsa20_blk_t *XY;
  salsa20_blk_t *V;
  uint8_t *S;
  uint8_t *B;
  size_t need;
  size_t XY_size;
  size_t V_size;
  size_t B_size;
  salsa20_blk_t *VROM;
  uint64_t NROM;
  yescrypt_region_t tmp;
  yescrypt_region_t *in_stack_fffffffffffffc88;
  SHA256_CTX_Y *ctx_00;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  size_t in_stack_fffffffffffffca0;
  HMAC_SHA256_CTX_Y *in_stack_fffffffffffffca8;
  SHA256_CTX_Y *in_stack_fffffffffffffcb0;
  yescrypt_region_t *in_stack_fffffffffffffcd0;
  size_t in_stack_fffffffffffffcf0;
  void *in_stack_fffffffffffffcf8;
  HMAC_SHA256_CTX_Y *in_stack_fffffffffffffd00;
  yescrypt_flags_t in_stack_fffffffffffffe00;
  uint32_t in_stack_fffffffffffffe04;
  uint32_t in_stack_fffffffffffffe08;
  uint32_t in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  uint uVar5;
  uint8_t *in_stack_fffffffffffffe18;
  salsa20_blk_t *in_stack_fffffffffffffe30;
  uint32_t in_stack_fffffffffffffe38;
  salsa20_blk_t *in_stack_fffffffffffffe40;
  salsa20_blk_t *in_stack_fffffffffffffe48;
  uint8_t *in_stack_fffffffffffffe50;
  uint8_t *in_stack_fffffffffffffe58;
  uint8_t *in_stack_fffffffffffffe98;
  uint64_t in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffea8;
  uint8_t *in_stack_fffffffffffffeb0;
  size_t in_stack_fffffffffffffeb8;
  uint8_t *in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffed0;
  undefined1 local_108 [32];
  undefined1 local_e8 [56];
  HMAC_SHA256_CTX_Y *local_b0;
  uint32_t *local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  undefined8 local_80;
  ulong local_78;
  yescrypt_region_t local_70;
  undefined8 local_40;
  undefined1 *local_38;
  long *local_30;
  int local_1c;
  
  if ((in_stack_00000028 & 0xffecfffc) == 0) {
    if (in_stack_00000038 < (SHA256_CTX_Y *)0x1fffffffe1) {
      if ((ulong)in_stack_00000010 * (ulong)in_stack_00000018 < 0x40000000) {
        if (in_stack_00000008 < 0x100000000) {
          if (((((in_stack_00000008 & in_stack_00000008 - 1) == 0) && (3 < in_stack_00000008)) &&
              (in_stack_00000010 != 0)) && (in_stack_00000018 != 0)) {
            size = (ulong)in_stack_00000010;
            if ((SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffff)) /
                        ZEXT416(in_stack_00000018),0) < size) ||
               (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1ffffffffffffff)) /
                       ZEXT416(in_stack_00000010),0) < in_stack_00000008)) {
              piVar3 = __errno_location();
              *piVar3 = 0xc;
              local_1c = -1;
            }
            else {
              if ((in_stack_00000028 & 1) != 0) {
                if (in_stack_00000008 / in_stack_00000018 < 4) {
                  piVar3 = __errno_location();
                  *piVar3 = 0x16;
                  return -1;
                }
                if (0x54e42523d03fa < (ulong)in_stack_00000018) {
                  piVar3 = __errno_location();
                  *piVar3 = 0xc;
                  return -1;
                }
              }
              local_78 = 0;
              local_80 = 0;
              if (in_RDI != 0) {
                auVar1._8_8_ = 0;
                auVar1._0_8_ = *(ulong *)(in_RDI + 0x18);
                local_78 = SUB168(auVar1 / (ZEXT416(in_stack_00000010) << 7),0);
                if (0xffffffff < local_78) {
                  piVar3 = __errno_location();
                  *piVar3 = 0x1b;
                  return -1;
                }
                if ((((local_78 & local_78 - 1) != 0) || (local_78 < 2)) ||
                   ((in_stack_00000028 & 1) == 0)) {
                  piVar3 = __errno_location();
                  *piVar3 = 0x16;
                  return -1;
                }
                local_80 = *(undefined8 *)(in_RDI + 8);
              }
              local_e8._48_8_ = 0;
              local_a0 = (ulong)in_stack_00000010 * 0x80 * in_stack_00000008;
              local_90 = local_a0;
              local_40 = in_RCX;
              local_38 = in_RDX;
              local_30 = in_RSI;
              if ((in_stack_00000028 & 0x30000) != 0) {
                if ((ulong)in_RSI[3] < local_a0) {
                  if ((((*in_RSI != 0) || (in_RSI[1] != 0)) || (in_RSI[2] != 0)) || (in_RSI[3] != 0)
                     ) {
                    piVar3 = __errno_location();
                    *piVar3 = 0x16;
                    return -1;
                  }
                  pvVar4 = alloc_region(in_stack_fffffffffffffcd0,size);
                  if (pvVar4 == (void *)0x0) {
                    return -1;
                  }
                }
                local_e8._48_8_ = local_30[1];
                local_a0 = 0;
              }
              local_88 = (ulong)in_stack_00000010 * 0x80 * (ulong)in_stack_00000018;
              local_a0 = local_88 + local_a0;
              if (local_a0 < local_88) {
                piVar3 = __errno_location();
                *piVar3 = 0xc;
                local_1c = -1;
              }
              else {
                local_98 = (ulong)in_stack_00000010 * 0x100;
                local_a0 = local_98 + local_a0;
                if (local_a0 < local_98) {
                  piVar3 = __errno_location();
                  *piVar3 = 0xc;
                  local_1c = -1;
                }
                else if (((in_stack_00000028 & 1) == 0) ||
                        (local_a0 = (ulong)in_stack_00000018 * 0x3040 + local_a0,
                        (ulong)in_stack_00000018 * 0x3040 <= local_a0)) {
                  if ((in_stack_00000028 & 0x30000) == 0) {
                    init_region(&local_70);
                    if ((ulong)local_30[3] < local_a0) {
                      iVar2 = free_region(in_stack_fffffffffffffc88);
                      if (iVar2 != 0) {
                        return -1;
                      }
                      pvVar4 = alloc_region(in_stack_fffffffffffffcd0,size);
                      if (pvVar4 == (void *)0x0) {
                        return -1;
                      }
                    }
                    local_a8 = (uint32_t *)local_30[1];
                    local_e8._48_8_ = (long)local_a8 + local_88;
                    local_e8._40_8_ = local_e8._48_8_ + local_90;
                  }
                  else {
                    pvVar4 = alloc_region(in_stack_fffffffffffffcd0,size);
                    if (pvVar4 == (void *)0x0) {
                      return -1;
                    }
                    local_a8 = (uint32_t *)local_70.aligned;
                    local_e8._40_8_ = (long)local_70.aligned + local_88;
                  }
                  local_b0 = (HMAC_SHA256_CTX_Y *)0x0;
                  if ((in_stack_00000028 & 1) != 0) {
                    local_b0 = (HMAC_SHA256_CTX_Y *)(local_e8._40_8_ + local_98);
                  }
                  if (in_stack_00000028 != 0) {
                    HMAC_SHA256_Init_Y(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                                       in_stack_fffffffffffffcf0);
                    HMAC_SHA256_Update_Y
                              ((HMAC_SHA256_CTX_Y *)
                               CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
                               in_stack_fffffffffffffc88,0x12a0d2);
                    HMAC_SHA256_Final_Y((uchar *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8
                                       );
                    local_38 = local_e8;
                    local_40 = 0x20;
                  }
                  PBKDF2_SHA256(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                                in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                                in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                                in_stack_fffffffffffffed0);
                  if ((in_stack_00000020 != 0) || (in_stack_00000028 != 0)) {
                    local_e8._0_8_ = *(undefined8 *)local_a8;
                    local_e8._8_8_ = *(undefined8 *)(local_a8 + 2);
                    local_e8._16_8_ = *(undefined8 *)(local_a8 + 4);
                    local_e8._24_8_ = *(undefined8 *)(local_a8 + 6);
                  }
                  if ((in_stack_00000018 == 1) || ((in_stack_00000028 & 1) != 0)) {
                    in_stack_fffffffffffffcb0 = (SHA256_CTX_Y *)local_e8;
                    in_stack_fffffffffffffc90 = (undefined4)local_78;
                    in_stack_fffffffffffffca0 = local_e8._40_8_;
                    in_stack_fffffffffffffca8 = local_b0;
                    smix(in_stack_fffffffffffffe18,
                         CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                         in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08,
                         in_stack_fffffffffffffe04,in_stack_fffffffffffffe00,
                         in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                         in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe50,in_stack_fffffffffffffe58);
                  }
                  else {
                    for (uVar5 = 0; uVar5 < in_stack_00000018; uVar5 = uVar5 + 1) {
                      in_stack_fffffffffffffc90 = (undefined4)local_78;
                      in_stack_fffffffffffffca8 = (HMAC_SHA256_CTX_Y *)0x0;
                      in_stack_fffffffffffffcb0 = (SHA256_CTX_Y *)0x0;
                      in_stack_fffffffffffffca0 = local_e8._40_8_;
                      smix(in_stack_fffffffffffffe18,CONCAT44(uVar5,in_stack_fffffffffffffe10),
                           in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08,
                           in_stack_fffffffffffffe04,in_stack_fffffffffffffe00,
                           in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                           in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
                           in_stack_fffffffffffffe50,in_stack_fffffffffffffe58);
                    }
                  }
                  if ((in_stack_00000028 != 0) && (in_stack_00000038 < (SHA256_CTX_Y *)0x20)) {
                    PBKDF2_SHA256(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                                  in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                                  in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                                  in_stack_fffffffffffffed0);
                  }
                  ctx_00 = in_stack_00000038;
                  PBKDF2_SHA256(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                                in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                                in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                                in_stack_fffffffffffffed0);
                  if ((in_stack_00000028 != 0) && ((in_stack_00000028 & 0x100000) == 0)) {
                    HMAC_SHA256_Init_Y(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                                       in_stack_fffffffffffffcf0);
                    HMAC_SHA256_Update_Y
                              ((HMAC_SHA256_CTX_Y *)
                               CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),ctx_00,
                               0x12a408);
                    HMAC_SHA256_Final_Y((uchar *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8
                                       );
                    if ((SHA256_CTX_Y *)0x20 < in_stack_00000038) {
                      in_stack_00000038 = (SHA256_CTX_Y *)0x20;
                    }
                    SHA256_Init_Y((SHA256_CTX_Y *)&stack0xfffffffffffffcdc);
                    SHA256_Update_Y(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                                    in_stack_fffffffffffffca0);
                    SHA256_Final_Y((uchar *)CONCAT44(in_stack_fffffffffffffc94,
                                                     in_stack_fffffffffffffc90),ctx_00);
                    memcpy(in_stack_00000030,local_108,(size_t)in_stack_00000038);
                  }
                  iVar2 = free_region((yescrypt_region_t *)ctx_00);
                  if (iVar2 == 0) {
                    local_1c = 0;
                  }
                  else {
                    local_1c = -1;
                  }
                }
                else {
                  piVar3 = __errno_location();
                  *piVar3 = 0xc;
                  local_1c = -1;
                }
              }
            }
          }
          else {
            piVar3 = __errno_location();
            *piVar3 = 0x16;
            local_1c = -1;
          }
        }
        else {
          piVar3 = __errno_location();
          *piVar3 = 0x1b;
          local_1c = -1;
        }
      }
      else {
        piVar3 = __errno_location();
        *piVar3 = 0x1b;
        local_1c = -1;
      }
    }
    else {
      piVar3 = __errno_location();
      *piVar3 = 0x1b;
      local_1c = -1;
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    local_1c = -1;
  }
  return local_1c;
}

Assistant:

static int
yescrypt_kdf_body(const yescrypt_shared_t * shared, yescrypt_local_t * local,
    const uint8_t * passwd, size_t passwdlen,
    const uint8_t * salt, size_t saltlen,
    uint64_t N, uint32_t r, uint32_t p, uint32_t t, yescrypt_flags_t flags,
    uint8_t * buf, size_t buflen)
{
	yescrypt_region_t tmp;
	uint64_t NROM;
	const salsa20_blk_t * VROM;
	size_t B_size, V_size, XY_size, need;
	uint8_t * B, * S;
	salsa20_blk_t * V, * XY;
	uint8_t sha256[32];
	uint8_t dk[sizeof(sha256)], * dkp = buf;

	/* Sanity-check parameters */
	if (flags & ~YESCRYPT_KNOWN_FLAGS) {
		errno = EINVAL;
		return -1;
	}
#if SIZE_MAX > UINT32_MAX
	if (buflen > (((uint64_t)(1) << 32) - 1) * 32) {
		errno = EFBIG;
		return -1;
	}
#endif
	if ((uint64_t)(r) * (uint64_t)(p) >= (1 << 30)) {
		errno = EFBIG;
		return -1;
	}
	if (N > UINT32_MAX) {
		errno = EFBIG;
		return -1;
	}
	if (((N & (N - 1)) != 0) || (N <= 3) || (r < 1) || (p < 1)) {
		errno = EINVAL;
		return -1;
	}
	if ((r > SIZE_MAX / 256 / p) ||
	    (N > SIZE_MAX / 128 / r)) {
		errno = ENOMEM;
		return -1;
	}
	if (flags & YESCRYPT_RW) {
		if (N / p <= 3) {
			errno = EINVAL;
			return -1;
		}
		if (p > SIZE_MAX / Salloc) {
			errno = ENOMEM;
			return -1;
		}
	}
#ifdef _OPENMP
	else if (N > SIZE_MAX / 128 / (r * p)) {
		errno = ENOMEM;
		return -1;
	}
#endif

	NROM = 0;
	VROM = NULL;
	if (shared) {
		NROM = shared->aligned_size / ((size_t)128 * r);
		if (NROM > UINT32_MAX) {
			errno = EFBIG;
			return -1;
		}
		if (((NROM & (NROM - 1)) != 0) || (NROM <= 1) ||
		    !(flags & YESCRYPT_RW)) {
			errno = EINVAL;
			return -1;
		}
		VROM = shared->aligned;
	}

	/* Allocate memory */
	V = NULL;
	V_size = (size_t)128 * r * N;
#ifdef _OPENMP
	if (!(flags & YESCRYPT_RW))
		V_size *= p;
#endif
	need = V_size;
	if (flags & __YESCRYPT_INIT_SHARED) {
		if (local->aligned_size < need) {
			if (local->base || local->aligned ||
			    local->base_size || local->aligned_size) {
				errno = EINVAL;
				return -1;
			}
			if (!alloc_region(local, need))
				return -1;
		}
		V = (salsa20_blk_t *)local->aligned;
		need = 0;
	}
	B_size = (size_t)128 * r * p;
	need += B_size;
	if (need < B_size) {
		errno = ENOMEM;
		return -1;
	}
	XY_size = (size_t)256 * r;
#ifdef _OPENMP
	XY_size *= p;
#endif
	need += XY_size;
	if (need < XY_size) {
		errno = ENOMEM;
		return -1;
	}
	if (flags & YESCRYPT_RW) {
		size_t S_size = (size_t)Salloc * p;
		need += S_size;
		if (need < S_size) {
			errno = ENOMEM;
			return -1;
		}
	}
	if (flags & __YESCRYPT_INIT_SHARED) {
		if (!alloc_region(&tmp, need))
			return -1;
		B = (uint8_t *)tmp.aligned;
		XY = (salsa20_blk_t *)((uint8_t *)B + B_size);
	} else {
		init_region(&tmp);
		if (local->aligned_size < need) {
			if (free_region(local))
				return -1;
			if (!alloc_region(local, need))
				return -1;
		}
		B = (uint8_t *)local->aligned;
		V = (salsa20_blk_t *)((uint8_t *)B + B_size);
		XY = (salsa20_blk_t *)((uint8_t *)V + V_size);
	}
	S = NULL;
	if (flags & YESCRYPT_RW)
		S = (uint8_t *)XY + XY_size;

	if (flags) {
		HMAC_SHA256_CTX_Y ctx;
		HMAC_SHA256_Init_Y(&ctx, "yescrypt-prehash",
		    (flags & __YESCRYPT_PREHASH) ? 16 : 8);
		HMAC_SHA256_Update_Y(&ctx, passwd, passwdlen);
		HMAC_SHA256_Final_Y(sha256, &ctx);
		passwd = sha256;
		passwdlen = sizeof(sha256);
	}

	/* 1: (B_0 ... B_{p-1}) <-- PBKDF2(P, S, 1, p * MFLen) */
	PBKDF2_SHA256(passwd, passwdlen, salt, saltlen, 1, B, B_size);

	if (t || flags)
		memcpy(sha256, B, sizeof(sha256));

	if (p == 1 || (flags & YESCRYPT_RW)) {
		smix(B, r, N, p, t, flags, V, NROM, VROM, XY, S, sha256);
	} else {
		uint32_t i;

		/* 2: for i = 0 to p - 1 do */
#ifdef _OPENMP
#pragma omp parallel for default(none) private(i) shared(B, r, N, p, t, flags, V, NROM, VROM, XY, S)
#endif
		for (i = 0; i < p; i++) {
			/* 3: B_i <-- MF(B_i, N) */
#ifdef _OPENMP
			smix(&B[(size_t)128 * r * i], r, N, 1, t, flags,
			    &V[(size_t)2 * r * i * N],
			    NROM, VROM,
			    &XY[(size_t)4 * r * i], NULL, NULL);
#else
			smix(&B[(size_t)128 * r * i], r, N, 1, t, flags, V,
			    NROM, VROM, XY, NULL, NULL);
#endif
		}
	}

	dkp = buf;
	if (flags && buflen < sizeof(dk)) {
		PBKDF2_SHA256(passwd, passwdlen, B, B_size, 1, dk, sizeof(dk));
		dkp = dk;
	}

	/* 5: DK <-- PBKDF2(P, B, 1, dkLen) */
	PBKDF2_SHA256(passwd, passwdlen, B, B_size, 1, buf, buflen);

	/*
	 * Except when computing classic scrypt, allow all computation so far
	 * to be performed on the client.  The final steps below match those of
	 * SCRAM (RFC 5802), so that an extension of SCRAM (with the steps so
	 * far in place of SCRAM's use of PBKDF2 and with SHA-256 in place of
	 * SCRAM's use of SHA-1) would be usable with yescrypt hashes.
	 */
	if (flags && !(flags & __YESCRYPT_PREHASH)) {
		/* Compute ClientKey */
		{
			HMAC_SHA256_CTX_Y ctx;
			HMAC_SHA256_Init_Y(&ctx, dkp, sizeof(dk));
			HMAC_SHA256_Update_Y(&ctx, "Client Key", 10);
			HMAC_SHA256_Final_Y(sha256, &ctx);
		}
		/* Compute StoredKey */
		{
			SHA256_CTX_Y ctx;
			size_t clen = buflen;
			if (clen > sizeof(dk))
				clen = sizeof(dk);
			SHA256_Init_Y(&ctx);
			SHA256_Update_Y(&ctx, sha256, sizeof(sha256));
			SHA256_Final_Y(dk, &ctx);
			memcpy(buf, dk, clen);
		}
	}

	if (free_region(&tmp))
		return -1;

	/* Success! */
	return 0;
}